

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddImageQuad
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,
          ImVec2 *uv1,ImVec2 *uv2,ImVec2 *uv3,ImVec2 *uv4,ImU32 col)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  if (0xffffff < col) {
    if ((this->_CmdHeader).TextureId != user_texture_id) {
      PushTextureID(this,user_texture_id);
      PrimReserve(this,6,4);
      PrimQuadUV(this,p1,p2,p3,p4,uv1,uv2,uv3,uv4,col);
      iVar1 = (this->_TextureIdStack).Size;
      iVar3 = iVar1 + -1;
      (this->_TextureIdStack).Size = iVar3;
      if (iVar3 == 0) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = (this->_TextureIdStack).Data[(long)iVar1 + -2];
      }
      (this->_CmdHeader).TextureId = pvVar2;
      _OnChangedTextureID(this);
      return;
    }
    PrimReserve(this,6,4);
    PrimQuadUV(this,p1,p2,p3,p4,uv1,uv2,uv3,uv4,col);
  }
  return;
}

Assistant:

void ImDrawList::AddImageQuad(ImTextureID user_texture_id, const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& uv1, const ImVec2& uv2, const ImVec2& uv3, const ImVec2& uv4, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = user_texture_id != _CmdHeader.TextureId;
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimQuadUV(p1, p2, p3, p4, uv1, uv2, uv3, uv4, col);

    if (push_texture_id)
        PopTextureID();
}